

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cc
# Opt level: O3

LogLevel muduo::initLogLevel(void)

{
  LogLevel LVar1;
  char *pcVar2;
  
  pcVar2 = getenv("MUDUO_LOG_TRACE");
  LVar1 = TRACE;
  if (pcVar2 == (char *)0x0) {
    pcVar2 = getenv("MUDUO_LOG_DEBUG");
    LVar1 = (pcVar2 == (char *)0x0) + DEBUG;
  }
  return LVar1;
}

Assistant:

Logger::LogLevel initLogLevel()
{
  if (::getenv("MUDUO_LOG_TRACE"))
    return Logger::TRACE;
  else if (::getenv("MUDUO_LOG_DEBUG"))
    return Logger::DEBUG;
  else
    return Logger::INFO;
}